

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ref.h
# Opt level: O1

void anurbs::Ref<anurbs::BrepLoop>::register_python(module *m)

{
  long *plVar1;
  undefined8 *puVar2;
  class_<anurbs::Ref<anurbs::BrepLoop>> *pcVar3;
  ulong uVar4;
  string name;
  type local_a2;
  type local_a1;
  class_<anurbs::Ref<anurbs::BrepLoop>_> local_a0;
  long *local_98;
  undefined8 local_90;
  long local_88;
  undefined8 uStack_80;
  code *local_78;
  long local_70;
  ulong local_68 [2];
  code *local_58;
  undefined8 local_50;
  long local_48;
  undefined1 local_40;
  code *local_38;
  undefined8 local_30;
  code *local_28;
  undefined8 local_20;
  
  local_78 = (code *)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Ref","");
  local_48 = 0x706f6f4c70657242;
  local_50 = 8;
  local_40 = 0;
  uVar4 = 0xf;
  if (local_78 != (code *)local_68) {
    uVar4 = local_68[0];
  }
  local_58 = (code *)&local_48;
  if ((local_70 + 8U < 0x10) && (uVar4 < local_70 + 8U)) {
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_78);
  }
  else {
    puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)&local_48);
  }
  local_98 = &local_88;
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_88 = *plVar1;
    uStack_80 = puVar2[3];
  }
  else {
    local_88 = *plVar1;
    local_98 = (long *)*puVar2;
  }
  local_90 = puVar2[1];
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  if (local_58 != (code *)&local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if (local_78 != (code *)local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  pybind11::class_<anurbs::Ref<anurbs::BrepLoop>_>::class_<>
            (&local_a0,(m->super_object).super_handle.m_ptr,(char *)local_98);
  pcVar3 = (class_<anurbs::Ref<anurbs::BrepLoop>> *)
           pybind11::class_<anurbs::Ref<anurbs::BrepLoop>>::
           def<anurbs::Ref<anurbs::BrepLoop>::register_python(pybind11::module&)::_lambda(anurbs::Ref<anurbs::BrepLoop>const&)_1_>
                     ((class_<anurbs::Ref<anurbs::BrepLoop>> *)&local_a0,"__len__",&local_a1);
  pcVar3 = (class_<anurbs::Ref<anurbs::BrepLoop>> *)
           pybind11::class_<anurbs::Ref<anurbs::BrepLoop>>::
           def<anurbs::Ref<anurbs::BrepLoop>::register_python(pybind11::module&)::_lambda(anurbs::Ref<anurbs::BrepLoop>const&,int)_1_>
                     (pcVar3,"__getitem__",&local_a2);
  local_78 = key_abi_cxx11_;
  local_70 = 0;
  pcVar3 = (class_<anurbs::Ref<anurbs::BrepLoop>> *)
           pybind11::class_<anurbs::Ref<anurbs::BrepLoop>>::
           def_property_readonly<std::__cxx11::string(anurbs::Ref<anurbs::BrepLoop>::*)()const>
                     (pcVar3,"key",(offset_in_Model_to_subr *)&local_78);
  local_58 = type_name_abi_cxx11_;
  local_50 = 0;
  pcVar3 = (class_<anurbs::Ref<anurbs::BrepLoop>> *)
           pybind11::class_<anurbs::Ref<anurbs::BrepLoop>>::
           def_property_readonly<std::__cxx11::string(anurbs::Ref<anurbs::BrepLoop>::*)()const>
                     (pcVar3,"type",(offset_in_Model_to_subr *)&local_58);
  local_28 = data;
  local_20 = 0;
  pcVar3 = (class_<anurbs::Ref<anurbs::BrepLoop>> *)
           pybind11::class_<anurbs::Ref<anurbs::BrepLoop>>::
           def_property_readonly<std::shared_ptr<anurbs::BrepLoop>(anurbs::Ref<anurbs::BrepLoop>::*)()const>
                     (pcVar3,"data",(offset_in_Model_to_subr *)&local_28);
  local_38 = attributes;
  local_30 = 0;
  pybind11::class_<anurbs::Ref<anurbs::BrepLoop>>::
  def_property_readonly<std::shared_ptr<anurbs::Attributes>(anurbs::Ref<anurbs::BrepLoop>::*)()const>
            (pcVar3,"attributes",(offset_in_Model_to_subr *)&local_38);
  pybind11::object::~object((object *)&local_a0);
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  return;
}

Assistant:

static void register_python(pybind11::module& m)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        const std::string name = std::string("Ref") + TData::type_name();

        py::class_<Type>(m, name.c_str())
            // methods
            .def("__len__", [](const Type& self) { return 2; })
            .def("__getitem__", [](const Type& self, const int i) -> py::object {
                switch (i) {
                case 0:
                    return py::cast(self.key());
                case 1:
                    return py::cast(self.data());
                default:
                    throw py::index_error();
                }
            })
            // read-only properties
            .def_property_readonly("key", &Type::key)
            .def_property_readonly("type", &Type::type_name)
            .def_property_readonly("data", &Type::data)
            .def_property_readonly("attributes", &Type::attributes)
        ;
    }